

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-test.h
# Opt level: O2

ParamGenerator<(anonymous_namespace)::TestVideoParam>
testing::ValuesIn<(anonymous_namespace)::TestVideoParam,9ul>
          (anon_struct_24_5_c1269b3d_for__M_head_impl (*array) [9])

{
  ParamGeneratorInterface<(anonymous_namespace)::TestVideoParam> *impl;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ParamGenerator<(anonymous_namespace)::TestVideoParam> PVar1;
  
  impl = (ParamGeneratorInterface<(anonymous_namespace)::TestVideoParam> *)operator_new(0x20);
  impl->_vptr_ParamGeneratorInterface = (_func_int **)&PTR__ValuesInIteratorRangeGenerator_00f4d6f8;
  impl[1]._vptr_ParamGeneratorInterface = (_func_int **)0x0;
  impl[2]._vptr_ParamGeneratorInterface = (_func_int **)0x0;
  impl[3]._vptr_ParamGeneratorInterface = (_func_int **)0x0;
  std::
  vector<(anonymous_namespace)::TestVideoParam,std::allocator<(anonymous_namespace)::TestVideoParam>>
  ::_M_range_initialize<(anonymous_namespace)::TestVideoParam_const*>
            ((vector<(anonymous_namespace)::TestVideoParam,std::allocator<(anonymous_namespace)::TestVideoParam>>
              *)(impl + 1),::(anonymous_namespace)::kTestVectors,
             &internal::ValuesInIteratorRangeGenerator<(anonymous_namespace)::TestVideoParam>::
              vtable);
  internal::ParamGenerator<(anonymous_namespace)::TestVideoParam>::ParamGenerator
            ((ParamGenerator<(anonymous_namespace)::TestVideoParam> *)array,impl);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestVideoParam>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestVideoParam>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)array;
  return (ParamGenerator<(anonymous_namespace)::TestVideoParam>)
         PVar1.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestVideoParam>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

internal::ParamGenerator<T> ValuesIn(const T (&array)[N]) {
  return ValuesIn(array, array + N);
}